

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall
fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word,int factor,float addWo)

{
  int32_t iVar1;
  int iVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  vector<int,_std::allocator<int>_> local_40;
  
  Dictionary::getSubwords
            (&local_40,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar3 = 0;
    do {
      Vector::addRow(vec,(this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  auVar4 = in_ZMM1._0_16_;
  iVar2 = factor;
  if (0 < factor) {
    do {
      Vector::addRow(vec,(this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)*local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      auVar4 = in_ZMM1._0_16_;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  if ((long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    auVar4 = vcvtusi2sd_avx512f(auVar4,(long)factor +
                                       ((long)local_40.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 2));
    Vector::mul(vec,(float)(1.0 / auVar4._0_8_));
  }
  if (0.0 < addWo) {
    iVar1 = Dictionary::getId((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,word);
    Vector::addRow(vec,(this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (long)iVar1,addWo);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word, int factor, float addWo) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int i = 0; i < ngrams.size(); i++) {
    addInputVector(vec, ngrams[i]);
  }
  for (int i = 0; i < factor; i++) {
    addInputVector(vec,ngrams[0]);//控制subwords中word emb和subword/char emb的加权
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / (ngrams.size()+factor));
  }
  if (addWo > 0) {
    const int id = dict_->getId(word);
    vec.addRow(*output_, id, addWo);
  }
}